

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void create_colorindex(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_color_quantizer *pjVar2;
  undefined1 *puVar3;
  JSAMPARRAY ppJVar4;
  int local_3c;
  int local_38;
  int pad;
  int val;
  int blksize;
  int nci;
  int k;
  int j;
  int i;
  JSAMPROW indexptr;
  my_cquantize_ptr cquantize;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->cquantize;
  if (cinfo->dither_mode == JDITHER_ORDERED) {
    local_3c = 0x1fe;
    *(undefined4 *)&pjVar2[1].new_color_map = 1;
  }
  else {
    local_3c = 0;
    *(undefined4 *)&pjVar2[1].new_color_map = 0;
  }
  ppJVar4 = (*cinfo->mem->alloc_sarray)
                      ((j_common_ptr)cinfo,1,local_3c + 0x100,cinfo->out_color_components);
  pjVar2[1].finish_pass = (_func_void_j_decompress_ptr *)ppJVar4;
  pad = *(int *)&pjVar2[1].color_quantize;
  for (k = 0; k < cinfo->out_color_components; k = k + 1) {
    iVar1 = *(int *)((long)&pjVar2[1].new_color_map + (long)k * 4 + 4);
    pad = pad / iVar1;
    if (local_3c != 0) {
      *(long *)(pjVar2[1].finish_pass + (long)k * 8) =
           *(long *)(pjVar2[1].finish_pass + (long)k * 8) + 0xff;
    }
    puVar3 = *(undefined1 **)(pjVar2[1].finish_pass + (long)k * 8);
    local_38 = 0;
    blksize = largest_input_value(cinfo,k,0,iVar1 + -1);
    for (nci = 0; nci < 0x100; nci = nci + 1) {
      while (blksize < nci) {
        local_38 = local_38 + 1;
        blksize = largest_input_value(cinfo,k,local_38,iVar1 + -1);
      }
      puVar3[nci] = (char)local_38 * (char)pad;
    }
    if (local_3c != 0) {
      for (nci = 1; nci < 0x100; nci = nci + 1) {
        puVar3[-nci] = *puVar3;
        puVar3[nci + 0xff] = puVar3[0xff];
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
create_colorindex (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  JSAMPROW indexptr;
  int i,j,k, nci, blksize, val, pad;

  /* For ordered dither, we pad the color index tables by MAXJSAMPLE in
   * each direction (input index values can be -MAXJSAMPLE .. 2*MAXJSAMPLE).
   * This is not necessary in the other dithering modes.  However, we
   * flag whether it was done in case user changes dithering mode.
   */
  if (cinfo->dither_mode == JDITHER_ORDERED) {
    pad = MAXJSAMPLE*2;
    cquantize->is_padded = TRUE;
  } else {
    pad = 0;
    cquantize->is_padded = FALSE;
  }

  cquantize->colorindex = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr) cinfo, JPOOL_IMAGE,
     (JDIMENSION) (MAXJSAMPLE+1 + pad),
     (JDIMENSION) cinfo->out_color_components);

  /* blksize is number of adjacent repeated entries for a component */
  blksize = cquantize->sv_actual;

  for (i = 0; i < cinfo->out_color_components; i++) {
    /* fill in colorindex entries for i'th color component */
    nci = cquantize->Ncolors[i]; /* # of distinct values for this color */
    blksize = blksize / nci;

    /* adjust colorindex pointers to provide padding at negative indexes. */
    if (pad)
      cquantize->colorindex[i] += MAXJSAMPLE;

    /* in loop, val = index of current output value, */
    /* and k = largest j that maps to current val */
    indexptr = cquantize->colorindex[i];
    val = 0;
    k = largest_input_value(cinfo, i, 0, nci-1);
    for (j = 0; j <= MAXJSAMPLE; j++) {
      while (j > k)		/* advance val if past boundary */
	k = largest_input_value(cinfo, i, ++val, nci-1);
      /* premultiply so that no multiplication needed in main processing */
      indexptr[j] = (JSAMPLE) (val * blksize);
    }
    /* Pad at both ends if necessary */
    if (pad)
      for (j = 1; j <= MAXJSAMPLE; j++) {
	indexptr[-j] = indexptr[0];
	indexptr[MAXJSAMPLE+j] = indexptr[MAXJSAMPLE];
      }
  }
}